

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

string * __thiscall
ghc::filesystem::path::generic_u8string_abi_cxx11_(string *__return_storage_ptr__,path *this)

{
  path *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE std::string path::generic_u8string() const
{
#ifdef GHC_OS_WINDOWS
    return generic_string<std::string::value_type, std::string::traits_type, std::string::allocator_type>();
#else
    return _path;
#endif
}